

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON_SubDFace * __thiscall ON_SubDHeap::FaceFromId(ON_SubDHeap *this,uint face_id)

{
  uint uVar1;
  ON_SubDFace *face;
  uint face_id_local;
  ON_SubDHeap *this_local;
  
  if ((face_id == 0) || (face_id == 0xffffffff)) {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubDHeap *)0x0;
  }
  else {
    this_local = (ON_SubDHeap *)
                 ON_FixedSizePool::ElementFromId(&this->m_fspf,m_offset_face_id,face_id);
    if ((this_local == (ON_SubDHeap *)0x0) ||
       (face_id != *(uint *)&(this_local->m_fspv).m_first_block)) {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubDHeap *)0x0;
    }
    else {
      uVar1 = ON_SubDComponentBase::ArchiveId((ON_SubDComponentBase *)this_local);
      if (uVar1 == 0xffffffff) {
        ON_SubDIncrementErrorCount();
        this_local = (ON_SubDHeap *)0x0;
      }
    }
  }
  return (ON_SubDFace *)this_local;
}

Assistant:

const class ON_SubDFace* ON_SubDHeap::FaceFromId(
  unsigned int face_id
  ) const
{
  if ( 0 == face_id || ON_UNSET_UINT_INDEX == face_id)
    return ON_SUBD_RETURN_ERROR(nullptr);
  const class ON_SubDFace* face = (const class ON_SubDFace*)m_fspf.ElementFromId(ON_SubDHeap::m_offset_face_id,face_id);
  if ( nullptr == face || face_id != face->m_id)
    return ON_SUBD_RETURN_ERROR(nullptr);
  if ( ON_UNSET_UINT_INDEX == face->ArchiveId() )
    return ON_SUBD_RETURN_ERROR(nullptr);
  return face;
}